

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

sz_ssize_t sznet::net::sockets::sz_read(sz_sock sockfd,char *buf,int len)

{
  ssize_t sVar1;
  size_t recvBufLen;
  void *recvBuf;
  int len_local;
  char *buf_local;
  sz_sock sockfd_local;
  
  sVar1 = recv(sockfd,buf,(long)len,0);
  return sVar1;
}

Assistant:

sz_ssize_t sz_read(sz_sock sockfd, char* buf, int len)
{
#ifdef SZ_OS_WINDOWS
	char* recvBuf = buf;
	int recvBufLen = len;
#else
	void* recvBuf = reinterpret_cast<void*>(buf);
	size_t recvBufLen = static_cast<size_t>(len);
#endif

	return ::recv(sockfd, recvBuf, recvBufLen, 0);
}